

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bsplitstrcb(const_bstring str,const_bstring splitStr,int pos,_func_int_void_ptr_int_int *cb,
               void *parm)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  uVar1 = 0xffffffff;
  if ((((-1 < pos) && (str != (const_bstring)0x0)) && (cb != (_func_int_void_ptr_int_int *)0x0)) &&
     ((iVar3 = str->slen, splitStr != (const_bstring)0x0 && pos <= iVar3 &&
      (iVar4 = splitStr->slen, -1 < iVar4)))) {
    if (iVar4 == 1) {
      iVar3 = bsplitcb(str,*splitStr->data,pos,cb,parm);
      return iVar3;
    }
    iVar5 = pos;
    if (iVar4 == 0) {
      do {
        if (str->slen <= pos) {
          return 0;
        }
        uVar1 = (*cb)(parm,pos,1);
        pos = pos + 1;
      } while (-1 < (int)uVar1);
    }
    else {
      for (; pos <= iVar3 - iVar4; pos = pos + 1) {
        iVar2 = bcmp(splitStr->data,str->data + pos,(long)iVar4);
        if (iVar2 == 0) {
          iVar3 = (*cb)(parm,iVar5,pos - iVar5);
          if (iVar3 < 0) {
            return iVar3;
          }
          iVar4 = splitStr->slen;
          pos = pos + iVar4;
          iVar3 = str->slen;
          iVar5 = pos;
        }
      }
      uVar1 = (*cb)(parm,iVar5,iVar3 - iVar5);
      uVar1 = uVar1 & (int)uVar1 >> 0x1f;
    }
  }
  return uVar1;
}

Assistant:

int bsplitstrcb (const_bstring str, const_bstring splitStr, int pos,
	int (* cb) (void * parm, int ofs, int len), void * parm) {
int i, p, ret;

	if (cb == NULL || str == NULL || pos < 0 || pos > str->slen
	 || splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;

	if (0 == splitStr->slen) {
		for (i=pos; i < str->slen; i++) {
			if ((ret = cb (parm, i, 1)) < 0) return ret;
		}
		return BSTR_OK;
	}

	if (splitStr->slen == 1)
		return bsplitcb (str, splitStr->data[0], pos, cb, parm);

	for (i=p=pos; i <= str->slen - splitStr->slen; i++) {
		if (0 == bstr__memcmp (splitStr->data, str->data + i,
		                       splitStr->slen)) {
			if ((ret = cb (parm, p, i - p)) < 0) return ret;
			i += splitStr->slen;
			p = i;
		}
	}
	if ((ret = cb (parm, p, str->slen - p)) < 0) return ret;
	return BSTR_OK;
}